

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enemy.cpp
# Opt level: O2

void __thiscall Enemy::setup(Enemy *this,Spritesheet *spritesheet)

{
  (this->startPos).field_0 = (this->super_AABB).center.field_0;
  std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
            (&this->animations[0].frames,
             (spritesheet->sprites).
             super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
             super__Vector_impl_data._M_start + 0x23);
  std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
            (&this->animations[0].frames,
             (spritesheet->sprites).
             super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
             super__Vector_impl_data._M_start + 0x24);
  std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
            (&this->animations[1].frames,
             (spritesheet->sprites).
             super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
             super__Vector_impl_data._M_start + 0x25);
  return;
}

Assistant:

void Enemy::setup(piksel::Spritesheet& spritesheet) {
    startPos = center;

    animations[WALKING].frames.push_back(spritesheet.sprites[35]);
    animations[WALKING].frames.push_back(spritesheet.sprites[36]);

    animations[DEAD].frames.push_back(spritesheet.sprites[37]);
}